

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SerialArena * __thiscall
google::protobuf::internal::SerialArena::New(SerialArena *this,Memory mem,void *owner)

{
  void *this_00;
  LogMessage *other;
  SerialArena *this_01;
  Block *b;
  byte local_59;
  LogMessage local_58;
  void *local_20;
  void *owner_local;
  Memory mem_local;
  
  local_20 = (void *)mem.size;
  mem_local.ptr = mem.ptr;
  local_59 = 0;
  owner_local = this;
  if (mem_local.ptr < (void *)0x50) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0x74);
    local_59 = 1;
    other = LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: (kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize) <= (mem.size): "
                      );
    LogFinisher::operator=((LogFinisher *)((long)&b + 3),other);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  this_00 = owner_local;
  Block::Block((Block *)owner_local,(Block *)0x0,(size_t)mem_local.ptr);
  this_01 = (SerialArena *)Block::Pointer((Block *)this_00,0x18);
  SerialArena(this_01,(Block *)this_00,local_20);
  return this_01;
}

Assistant:

SerialArena* SerialArena::New(Memory mem, void* owner) {
  GOOGLE_DCHECK_LE(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize, mem.size);

  auto b = new (mem.ptr) Block{nullptr, mem.size};
  return new (b->Pointer(kBlockHeaderSize)) SerialArena(b, owner);
}